

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void lowbd_inv_txfm2d_add_no_identity_ssse3
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  byte in_CL;
  byte in_R8B;
  int in_R9D;
  int i_2;
  int i_1;
  int j_1;
  __m128i temp [8];
  int j;
  __m128i *_buf1;
  __m128i buf0 [64];
  int i;
  int lr_flip;
  int ud_flip;
  transform_1d_ssse3 col_txfm;
  transform_1d_ssse3 row_txfm;
  int fun_idx_y;
  int fun_idx_x;
  int rect_type;
  int input_stride;
  int buf_size_nonzero_h_div8;
  int buf_size_nonzero_w;
  int buf_size_w_div8;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  int eoby;
  int eobx;
  __m128i buf1 [512];
  int local_2528;
  int in_stack_ffffffffffffdadc;
  undefined4 in_stack_ffffffffffffdae0;
  int iVar1;
  int in_stack_ffffffffffffdae4;
  int in_stack_ffffffffffffdaec;
  int32_t *in_stack_ffffffffffffdaf0;
  int in_stack_ffffffffffffdb0c;
  int in_stack_ffffffffffffdb10;
  int in_stack_ffffffffffffdb14;
  int in_stack_ffffffffffffdb18;
  int in_stack_ffffffffffffdb1c;
  __m128i *in_stack_ffffffffffffdb20;
  __m128i *in_stack_ffffffffffffdb28;
  __m128i *in_stack_ffffffffffffdb50;
  __m128i *in_stack_ffffffffffffdb58;
  int local_2494;
  longlong local_2488 [128];
  int local_2084;
  int local_2080;
  int local_207c;
  transform_1d_ssse3 local_2078;
  transform_1d_ssse3 local_2070;
  int local_2064;
  int local_2060;
  int local_205c;
  int local_2058;
  int local_2054;
  int local_2050;
  int local_204c;
  int local_2048;
  int local_2044;
  int local_2040;
  int local_203c;
  char *local_2038;
  int local_2030;
  int local_202c;
  longlong local_2028 [1026];
  byte local_16;
  byte local_15;
  
  local_16 = in_R8B;
  local_15 = in_CL;
  get_eobx_eoby_scan_default(&local_202c,&local_2030,in_R8B,in_R9D);
  local_2038 = av1_inv_txfm_shift_ls[local_16];
  local_203c = get_txw_idx(local_16);
  local_2040 = get_txh_idx(local_16);
  local_2044 = tx_size_wide[local_16];
  local_2048 = tx_size_high[local_16];
  local_204c = local_2044 >> 3;
  local_2050 = (local_202c + 8 >> 3) << 3;
  local_2054 = local_2030 + 8 >> 3;
  local_2528 = local_2048;
  if (0x20 < local_2048) {
    local_2528 = 0x20;
  }
  local_2058 = local_2528;
  local_205c = get_rect_tx_log_ratio(local_2044,local_2048);
  local_2060 = lowbd_txfm_all_1d_zeros_idx[local_202c];
  local_2064 = lowbd_txfm_all_1d_zeros_idx[local_2030];
  local_2070 = lowbd_txfm_all_1d_zeros_w8_arr[local_203c][""[local_15]][local_2060];
  local_2078 = lowbd_txfm_all_1d_zeros_w8_arr[local_2040][""[local_15]][local_2064];
  get_flip_cfg(local_15,&local_207c,&local_2080);
  for (local_2084 = 0; local_2084 < local_2054; local_2084 = local_2084 + 1) {
    load_buffer_32bit_to_16bit
              (in_stack_ffffffffffffdaf0,in_stack_ffffffffffffdaec,
               (__m128i *)CONCAT44(in_stack_ffffffffffffdae4,in_stack_ffffffffffffdae0),
               in_stack_ffffffffffffdadc);
    if ((local_205c == 1) || (local_205c == -1)) {
      round_shift_ssse3((__m128i *)local_2488,(__m128i *)local_2488,local_2050);
    }
    (*local_2070)((__m128i *)local_2488,(__m128i *)local_2488);
    round_shift_16bit_ssse3((__m128i *)local_2488,local_2044,(int)*local_2038);
    if (local_2080 == 0) {
      for (in_stack_ffffffffffffdae4 = 0; in_stack_ffffffffffffdae4 < local_204c;
          in_stack_ffffffffffffdae4 = in_stack_ffffffffffffdae4 + 1) {
        transpose_16bit_8x8(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      }
    }
    else {
      for (local_2494 = 0; local_2494 < local_204c; local_2494 = local_2494 + 1) {
        flip_buf_sse2((__m128i *)(local_2488 + (long)(local_2494 << 3) * 2),
                      (__m128i *)&stack0xffffffffffffdae8,8);
        transpose_16bit_8x8(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      }
    }
  }
  for (iVar1 = 0; iVar1 < local_204c; iVar1 = iVar1 + 1) {
    (*local_2078)((__m128i *)(local_2028 + (long)(iVar1 * local_2048) * 2),
                  (__m128i *)(local_2028 + (long)(iVar1 * local_2048) * 2));
    round_shift_16bit_ssse3
              ((__m128i *)(local_2028 + (long)(iVar1 * local_2048) * 2),local_2048,
               (int)local_2038[1]);
  }
  if (local_2044 < 0x10) {
    if (local_2044 == 8) {
      lowbd_write_buffer_8xn_sse2
                (in_stack_ffffffffffffdb28,(uint8_t *)in_stack_ffffffffffffdb20,
                 in_stack_ffffffffffffdb1c,in_stack_ffffffffffffdb18,in_stack_ffffffffffffdb14);
    }
  }
  else {
    for (iVar1 = 0; iVar1 < local_2044 >> 4; iVar1 = iVar1 + 1) {
      lowbd_write_buffer_16xn_sse2
                (in_stack_ffffffffffffdb20,
                 (uint8_t *)CONCAT44(in_stack_ffffffffffffdb1c,in_stack_ffffffffffffdb18),
                 in_stack_ffffffffffffdb14,in_stack_ffffffffffffdb10,in_stack_ffffffffffffdb0c);
    }
  }
  return;
}

Assistant:

static inline void lowbd_inv_txfm2d_add_no_identity_ssse3(
    const int32_t *input, uint8_t *output, int stride, TX_TYPE tx_type,
    TX_SIZE tx_size, int eob) {
  __m128i buf1[64 * 8];
  int eobx, eoby;
  get_eobx_eoby_scan_default(&eobx, &eoby, tx_size, eob);
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_w_div8 = txfm_size_col >> 3;
  const int buf_size_nonzero_w = ((eobx + 8) >> 3) << 3;
  const int buf_size_nonzero_h_div8 = (eoby + 8) >> 3;
  const int input_stride = AOMMIN(32, txfm_size_row);
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);

  const int fun_idx_x = lowbd_txfm_all_1d_zeros_idx[eobx];
  const int fun_idx_y = lowbd_txfm_all_1d_zeros_idx[eoby];
  const transform_1d_ssse3 row_txfm =
      lowbd_txfm_all_1d_zeros_w8_arr[txw_idx][hitx_1d_tab[tx_type]][fun_idx_x];
  const transform_1d_ssse3 col_txfm =
      lowbd_txfm_all_1d_zeros_w8_arr[txh_idx][vitx_1d_tab[tx_type]][fun_idx_y];

  assert(col_txfm != NULL);
  assert(row_txfm != NULL);
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < buf_size_nonzero_h_div8; i++) {
    __m128i buf0[64];
    load_buffer_32bit_to_16bit(input + 8 * i, input_stride, buf0,
                               buf_size_nonzero_w);
    if (rect_type == 1 || rect_type == -1) {
      round_shift_ssse3(buf0, buf0, buf_size_nonzero_w);  // rect special code
    }
    row_txfm(buf0, buf0);
    round_shift_16bit_ssse3(buf0, txfm_size_col, shift[0]);
    __m128i *_buf1 = buf1 + i * 8;
    if (lr_flip) {
      for (int j = 0; j < buf_size_w_div8; ++j) {
        __m128i temp[8];
        flip_buf_sse2(buf0 + 8 * j, temp, 8);
        transpose_16bit_8x8(temp,
                            _buf1 + txfm_size_row * (buf_size_w_div8 - 1 - j));
      }
    } else {
      for (int j = 0; j < buf_size_w_div8; ++j) {
        transpose_16bit_8x8(buf0 + 8 * j, _buf1 + txfm_size_row * j);
      }
    }
  }
  for (int i = 0; i < buf_size_w_div8; i++) {
    col_txfm(buf1 + i * txfm_size_row, buf1 + i * txfm_size_row);
    round_shift_16bit_ssse3(buf1 + i * txfm_size_row, txfm_size_row, shift[1]);
  }

  if (txfm_size_col >= 16) {
    for (int i = 0; i < (txfm_size_col >> 4); i++) {
      lowbd_write_buffer_16xn_sse2(buf1 + i * txfm_size_row * 2,
                                   output + 16 * i, stride, ud_flip,
                                   txfm_size_row);
    }
  } else if (txfm_size_col == 8) {
    lowbd_write_buffer_8xn_sse2(buf1, output, stride, ud_flip, txfm_size_row);
  }
}